

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_list.cpp
# Opt level: O0

void __thiscall
duckdb::MultiFilePushdownInfo::MultiFilePushdownInfo(MultiFilePushdownInfo *this,LogicalGet *get)

{
  bool bVar1;
  reference this_00;
  LogicalGet *in_RSI;
  idx_t *in_RDI;
  ColumnIndex *col_id;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::ColumnIndex,_true> *__range1;
  vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *in_stack_ffffffffffffff88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff90;
  __normal_iterator<duckdb::ColumnIndex_*,_std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>_>
  local_30;
  idx_t *local_28;
  LogicalGet *local_10;
  
  *in_RDI = in_RSI->table_index;
  in_RDI[1] = (idx_t)&in_RSI->names;
  local_10 = in_RSI;
  vector<unsigned_long,_true>::vector((vector<unsigned_long,_true> *)0x1554fe1);
  LogicalGet::GetColumnIds(local_10);
  vector<duckdb::ColumnIndex,_true>::vector
            ((vector<duckdb::ColumnIndex,_true> *)in_stack_ffffffffffffff90,
             (vector<duckdb::ColumnIndex,_true> *)in_stack_ffffffffffffff88);
  in_RDI[8] = (idx_t)&local_10->extra_info;
  local_28 = in_RDI + 5;
  local_30._M_current =
       (ColumnIndex *)
       ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::begin
                 (in_stack_ffffffffffffff88);
  ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::end
            (in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<duckdb::ColumnIndex_*,_std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<duckdb::ColumnIndex_*,_std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<duckdb::ColumnIndex_*,_std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>_>
              ::operator*(&local_30);
    in_stack_ffffffffffffff88 =
         (vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)(in_RDI + 2);
    in_stack_ffffffffffffff90 =
         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
         ColumnIndex::GetPrimaryIndex(this_00);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (in_stack_ffffffffffffff90,(value_type_conflict1 *)in_stack_ffffffffffffff88);
    __gnu_cxx::
    __normal_iterator<duckdb::ColumnIndex_*,_std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

MultiFilePushdownInfo::MultiFilePushdownInfo(LogicalGet &get)
    : table_index(get.table_index), column_names(get.names), column_indexes(get.GetColumnIds()),
      extra_info(get.extra_info) {
	for (auto &col_id : column_indexes) {
		column_ids.push_back(col_id.GetPrimaryIndex());
	}
}